

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Valuator.cxx
# Opt level: O0

void __thiscall Fl_Valuator::step(Fl_Valuator *this,double s)

{
  bool bVar1;
  double dVar2;
  double local_18;
  double s_local;
  Fl_Valuator *this_local;
  
  local_18 = s;
  if (s < 0.0) {
    local_18 = -s;
  }
  dVar2 = rint(local_18);
  this->A = dVar2;
  this->B = 1;
  while( true ) {
    bVar1 = false;
    if (4.66e-10 < ABS(local_18 - this->A / (double)this->B)) {
      bVar1 = this->B < 0xccccccd;
    }
    if (!bVar1) break;
    this->B = this->B * 10;
    dVar2 = rint(local_18 * (double)this->B);
    this->A = dVar2;
  }
  return;
}

Assistant:

void Fl_Valuator::step(double s) {
  if (s < 0) s = -s;
  A = rint(s);
  B = 1;
  while (fabs(s-A/B) > epsilon && B<=(0x7fffffff/10)) {B *= 10; A = rint(s*B);}
}